

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

MemoryRegionSection *
address_space_lookup_region(AddressSpaceDispatch *d,hwaddr addr,_Bool resolve_subpage)

{
  _Bool _Var1;
  MemoryRegion_conflict *__mptr;
  subpage_t *subpage;
  MemoryRegionSection *section;
  _Bool resolve_subpage_local;
  hwaddr addr_local;
  AddressSpaceDispatch *d_local;
  
  subpage = (subpage_t *)d->mru_section;
  if ((subpage != (subpage_t *)0x0) && (subpage != (subpage_t *)(d->map).sections)) {
    _Var1 = section_covers_addr((MemoryRegionSection *)subpage,addr);
    if (_Var1) goto LAB_012acc07;
  }
  subpage = (subpage_t *)phys_page_find(d,addr);
  d->mru_section = (MemoryRegionSection *)subpage;
LAB_012acc07:
  if ((resolve_subpage) && (((ulong)((subpage->iomem).ops)->read & 0x100) != 0)) {
    subpage = (subpage_t *)
              ((d->map).sections +
              *(ushort *)((long)&(subpage->iomem).ops[2].read_with_attrs + (addr & 0x3fff) * 2));
  }
  return (MemoryRegionSection *)subpage;
}

Assistant:

static MemoryRegionSection *address_space_lookup_region(AddressSpaceDispatch *d,
                                                        hwaddr addr,
                                                        bool resolve_subpage)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = d->uc;
#endif
    MemoryRegionSection *section = d->mru_section;
    subpage_t *subpage;

    if (!section || section == &d->map.sections[PHYS_SECTION_UNASSIGNED] ||
        !section_covers_addr(section, addr)) {
        section = phys_page_find(d, addr);
        d->mru_section = section;
    }
    if (resolve_subpage && section->mr->subpage) {
        subpage = container_of(section->mr, subpage_t, iomem);
        section = &d->map.sections[subpage->sub_section[SUBPAGE_IDX(addr)]];
    }
    return section;
}